

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

MemChunk * __thiscall
cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::arenaAlloc
          (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this,size_type chunkSize)

{
  int iVar1;
  MemSegment *this_00;
  ulong uVar2;
  undefined4 extraout_var;
  MemChunk *chunk;
  MemSegment *seg;
  size_type segSize;
  size_type fp;
  size_type estSize;
  size_type chunkSize_local;
  MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this_local;
  
  seg = (MemSegment *)(chunkSize + 0x18);
  if (chunkSize < seg) {
    if ((this->m_footprintLimit == 0) ||
       ((segSize = (long)&seg->m_size + this->m_footprint, this->m_footprint < segSize &&
        (segSize <= this->m_footprintLimit)))) {
      fp = (size_type)seg;
      estSize = chunkSize;
      chunkSize_local = (size_type)this;
      this_00 = (MemSegment *)MmapArena::getSegment(this->m_arena,(size_t *)&seg);
      NoActionMemLogger::logGetSegment(this->m_logger,this_00,(size_t)seg);
      if (this_00 == (MemSegment *)0x0) {
        this_local = (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *)0x0;
      }
      else {
        uVar2 = (long)&seg->m_size + this->m_footprint;
        this->m_footprint = uVar2;
        if (this->m_maxFootprint < uVar2) {
          this->m_maxFootprint = this->m_footprint;
        }
        iVar1 = MemSegment::init(this_00,(EVP_PKEY_CTX *)seg);
        if (this->m_segList == (MemSegment *)0x0) {
          this->m_segList = this_00;
          MemSegment::setNext(this_00,(MemSegment *)0x0);
          this->m_release_checks = 0xfff;
        }
        else {
          MemSegment::setNext(this_00,this->m_segList);
          this->m_segList = this_00;
        }
        this_local = (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *)
                     splitChunk(this,(MemChunk *)CONCAT44(extraout_var,iVar1),estSize);
      }
    }
    else {
      this_local = (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *)0x0;
    }
  }
  else {
    this_local = (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *)0x0;
  }
  return (MemChunk *)this_local;
}

Assistant:

MemChunk*
    arenaAlloc (size_type chunkSize)
    {
        size_type estSize;             /* allocation size */

        estSize = chunkSize + SEGMENT_OVERHEAD;
        if (estSize <= chunkSize)
        {
            // Technically can never reach here due to the MAX_REQUEST value
            //
            // However it is always good to have a check.
            return nullptr;
        }

        /*
         * Check user specified foot print limit
         */
        if (m_footprintLimit != 0)
        {
            size_type fp = m_footprint + estSize;
            if (fp <= m_footprint || fp > m_footprintLimit)
            {
                return nullptr;
            }
        }

        /*
         * Request memory segments from arena.
         */
        size_type segSize = estSize;
        MemSegment* seg = (MemSegment*)m_arena.getSegment (segSize);
        m_logger.logGetSegment (seg, segSize);

        /*
         * Initialize the segment obtained.
         */
        if (seg)
        {

            if ((m_footprint += segSize) > m_maxFootprint)
            {
                m_maxFootprint = m_footprint;
            }

            MemChunk* chunk = seg->init (segSize);

            if (m_segList == nullptr)
            {
                m_segList = seg;
                seg->setNext (nullptr);

                m_release_checks = MAX_RELEASE_CHECK_RATE;
            }
            else
            {
                seg->setNext (m_segList);
                m_segList = seg;
            }

            return splitChunk (chunk, chunkSize);
        }
        return nullptr;
    }